

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

Mat * __thiscall ncnn::Mat::reshape(Mat *this,int _w,int _h,Allocator *_allocator)

{
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  Mat *in_RDI;
  void *mptr;
  void *ptr;
  int i;
  Mat *m;
  Mat *pMVar1;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined8 in_stack_ffffffffffffffb8;
  Mat *in_stack_ffffffffffffffc0;
  int local_38;
  
  if (*(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34) *
      (int)in_RSI[7] == in_EDX * in_ECX) {
    pMVar1 = in_RDI;
    if (((int)in_RSI[5] < 3) ||
       (in_RSI[8] ==
        (long)*(int *)((long)in_RSI + 0x2c) * (long)(int)in_RSI[6] *
        (long)*(int *)((long)in_RSI + 0x34))) {
      Mat(in_RDI,in_RDI);
      in_RDI->dims = 2;
      in_RDI->w = in_EDX;
      in_RDI->h = in_ECX;
      in_RDI->d = 1;
      in_RDI->c = 1;
      in_RDI->cstep = (long)in_EDX * (long)in_ECX;
    }
    else {
      Mat(in_RDI);
      create(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
             (int)in_stack_ffffffffffffffb8,
             CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
             (int)((ulong)in_RSI >> 0x20),(Allocator *)pMVar1);
      for (local_38 = 0; local_38 < (int)in_RSI[7]; local_38 = local_38 + 1) {
        memcpy((void *)((long)in_RDI->data +
                       (long)local_38 * (long)*(int *)((long)in_RSI + 0x2c) * (long)(int)in_RSI[6] *
                       (long)*(int *)((long)in_RSI + 0x34) * in_RSI[2]),
               (void *)(*in_RSI + (long)local_38 * in_RSI[8] * in_RSI[2]),
               (long)*(int *)((long)in_RSI + 0x2c) * (long)(int)in_RSI[6] *
               (long)*(int *)((long)in_RSI + 0x34) * in_RSI[2]);
      }
    }
  }
  else {
    Mat(in_RDI);
    pMVar1 = in_RDI;
  }
  return pMVar1;
}

Assistant:

Mat Mat::reshape(int _w, int _h, Allocator* _allocator) const
{
    if (w * h * d * c != _w * _h)
        return Mat();

    if (dims >= 3 && cstep != (size_t)w * h * d)
    {
        Mat m;
        m.create(_w, _h, elemsize, elempack, _allocator);

        // flatten
        for (int i = 0; i < c; i++)
        {
            const void* ptr = (unsigned char*)data + i * cstep * elemsize;
            void* mptr = (unsigned char*)m.data + (size_t)i * w * h * d * elemsize;
            memcpy(mptr, ptr, (size_t)w * h * d * elemsize);
        }

        return m;
    }

    Mat m = *this;

    m.dims = 2;
    m.w = _w;
    m.h = _h;
    m.d = 1;
    m.c = 1;

    m.cstep = (size_t)_w * _h;

    return m;
}